

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall QL_Manager::ParseSelectAttrs(QL_Manager *this,int nSelAttrs,RelAttr *selAttrs)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  ulong uVar4;
  RelAttr attr;
  
  if (nSelAttrs == 1) {
    __s = selAttrs->attrName;
    __n = strlen(__s);
    iVar2 = strncmp(__s,"*",__n);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else if (nSelAttrs < 1) {
    return 0;
  }
  uVar4 = 1;
  if (1 < nSelAttrs) {
    uVar4 = (ulong)(uint)nSelAttrs;
  }
  lVar3 = 0;
  do {
    attr.attrName = *(char **)((long)&selAttrs->attrName + lVar3);
    attr.relName = *(char **)((long)&selAttrs->relName + lVar3);
    bVar1 = IsValidAttr(this,attr);
    if (!bVar1) {
      return 0x194;
    }
    lVar3 = lVar3 + 0x10;
  } while (uVar4 * 0x10 != lVar3);
  return 0;
}

Assistant:

RC QL_Manager::ParseSelectAttrs(int nSelAttrs, const RelAttr selAttrs[]){
  // If it's select *, then it's valid
  if((nSelAttrs == 1 && strncmp(selAttrs[0].attrName, "*", strlen(selAttrs[0].attrName)) == 0))
    return (0);

  for(int i=0; i < nSelAttrs; i++){
    // Check that attribute name is valid:
    if(!IsValidAttr(selAttrs[i]))
      return (QL_ATTRNOTFOUND);  

  }
  return (0);
}